

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::filter_coarsen_min_qual
          (Omega_h *this,Read<signed_char> *cand_codes,Reals *cand_quals,Real min_qual)

{
  int *piVar1;
  Alloc *pAVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  Read<signed_char> RVar4;
  Bytes keep_dirs;
  Read<signed_char> local_58;
  Read<signed_char> local_48;
  Read<double> local_38;
  Alloc *local_28;
  void *local_20;
  void *pvVar3;
  
  local_38.write_.shared_alloc_.alloc = (cand_quals->write_).shared_alloc_.alloc;
  if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_38.write_.shared_alloc_.alloc =
           (Alloc *)((local_38.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_38.write_.shared_alloc_.alloc)->use_count =
           (local_38.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_38.write_.shared_alloc_.direct_ptr = (cand_quals->write_).shared_alloc_.direct_ptr;
  each_geq_to<double>((Omega_h *)&local_28,&local_38,min_qual);
  pAVar2 = local_38.write_.shared_alloc_.alloc;
  if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_38.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_58.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
  if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.write_.shared_alloc_.alloc)->use_count =
           (local_58.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_58.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
  local_48.write_.shared_alloc_.alloc = local_28;
  if (((ulong)local_28 & 7) == 0 && local_28 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48.write_.shared_alloc_.alloc = (Alloc *)(local_28->size * 8 + 1);
    }
    else {
      local_28->use_count = local_28->use_count + 1;
    }
  }
  local_48.write_.shared_alloc_.direct_ptr = local_20;
  RVar4 = filter_coarsen_dirs(this,&local_58,&local_48);
  pAVar2 = local_48.write_.shared_alloc_.alloc;
  pvVar3 = RVar4.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX;
    }
  }
  pAVar2 = local_58.write_.shared_alloc_.alloc;
  if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_58.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar3 = extraout_RDX_00;
    }
  }
  if (((ulong)local_28 & 7) == 0 && local_28 != (Alloc *)0x0) {
    piVar1 = &local_28->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_28);
      operator_delete(local_28,0x48);
      pvVar3 = extraout_RDX_01;
    }
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<I8> filter_coarsen_min_qual(
    Read<I8> cand_codes, Reals cand_quals, Real min_qual) {
  auto keep_dirs = each_geq_to(cand_quals, min_qual);
  return filter_coarsen_dirs(cand_codes, keep_dirs);
}